

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_7bit_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  ulong uVar1;
  size_t local_48;
  ulong local_40;
  size_t cursize;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  size_t sStack_20;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  uVar1 = (part->encstate).bufend - (part->encstate).bufbeg;
  sStack_20 = size;
  if (uVar1 < size) {
    sStack_20 = uVar1;
  }
  local_40 = 0;
  size_local = (size_t)buffer;
  while( true ) {
    if (sStack_20 <= local_40) {
      return local_40;
    }
    *(char *)size_local = (part->encstate).buf[(part->encstate).bufbeg];
    if (((int)*(char *)size_local & 0x80U) != 0) break;
    (part->encstate).bufbeg = (part->encstate).bufbeg + 1;
    local_40 = local_40 + 1;
    size_local = size_local + 1;
  }
  if (local_40 == 0) {
    local_48 = 0xffffffffffffffff;
  }
  else {
    local_48 = local_40;
  }
  return local_48;
}

Assistant:

static size_t encoder_7bit_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t cursize = st->bufend - st->bufbeg;

  (void) ateof;

  if(size > cursize)
    size = cursize;

  for(cursize = 0; cursize < size; cursize++) {
    *buffer = st->buf[st->bufbeg];
    if(*buffer++ & 0x80)
      return cursize? cursize: READ_ERROR;
    st->bufbeg++;
  }

  return cursize;
}